

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O2

istream * PyreNet::operator>>(istream *is,NeuralNet *nn)

{
  pointer pLVar1;
  Layer *l;
  pointer l_00;
  Layer local_58;
  int local_34 [2];
  int layerSize;
  
  std::istream::operator>>((istream *)is,&nn->inputSize);
  std::istream::operator>>((istream *)is,local_34);
  Layer::Layer(&local_58,0,0,(Activation *)0x0);
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::resize
            (&nn->layers,(long)local_34[0],&local_58);
  std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::~vector(&local_58.nodes);
  pLVar1 = (nn->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (l_00 = (nn->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
              _M_impl.super__Vector_impl_data._M_start; l_00 != pLVar1; l_00 = l_00 + 1) {
    operator>>(is,l_00);
  }
  return is;
}

Assistant:

std::istream& operator>>(std::istream& is, NeuralNet& nn) {
        is >> nn.inputSize;
        int layerSize;
        is >> layerSize;
        nn.layers.resize(layerSize, Layer(0, 0, nullptr));
        for (Layer& l : nn.layers)
            is >> l;
        return is;
    }